

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O1

nh_bool ext_cmd_getlin_hook(char *base,void *hook_arg)

{
  int iVar1;
  long lVar2;
  nh_bool nVar3;
  int iVar4;
  size_t __n;
  uint uVar5;
  long lVar6;
  
  iVar1 = *(int *)((long)hook_arg + 0x10);
  if ((long)iVar1 < 1) {
    uVar5 = 0xffffffff;
  }
  else {
    lVar2 = *hook_arg;
    __n = strlen(base);
    uVar5 = 0xffffffff;
    lVar6 = 0;
    do {
      iVar4 = strncasecmp(base,*(char **)(lVar2 + lVar6 * 8),__n);
      if (iVar4 == 0) {
        if (uVar5 != 0xffffffff) goto LAB_0010a30f;
        uVar5 = (uint)lVar6;
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  if ((int)uVar5 < 0) {
LAB_0010a30f:
    nVar3 = '\0';
  }
  else {
    strcpy(base,*(char **)(*hook_arg + (ulong)uVar5 * 8));
    nVar3 = '\x01';
  }
  return nVar3;
}

Assistant:

static nh_bool ext_cmd_getlin_hook(char *base, void *hook_arg)
{
    int oindex, com_index;
    struct extcmd_hook_args *hpa = hook_arg;

    com_index = -1;
    for (oindex = 0; oindex < hpa->listlen; oindex++) {
	if (!strncasecmp(base, hpa->namelist[oindex], strlen(base))) {
	    if (com_index == -1)	/* no matches yet */
		com_index = oindex;
	    else			/* more than 1 match */
		return FALSE;
	}
    }
    if (com_index >= 0) {
	strcpy(base, hpa->namelist[com_index]);
	return TRUE;
    }

    return FALSE;	/* didn't match anything */
}